

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmloutput.cpp
# Opt level: O2

void __thiscall XmlOutput::closeTag(XmlOutput *this)

{
  XMLState XVar1;
  QTextStream *pQVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  XVar1 = this->currentState;
  if (XVar1 == Attribute) {
    QTextStream::operator<<(this->xmlFile," />");
    QList<QString>::removeLast(&(this->tagStack).super_QList<QString>);
    this->currentState = Tag;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      decreaseIndent(this);
      return;
    }
  }
  else {
    if (XVar1 == Tag) {
      decreaseIndent(this);
      if (this->format == NewLine) {
        pQVar2 = (QTextStream *)Qt::endl(this->xmlFile);
        QTextStream::operator<<(pQVar2,(QString *)&this->currentIndent);
      }
      pQVar2 = (QTextStream *)QTextStream::operator<<(this->xmlFile,"</");
      iVar3 = QList<QString>::end(&(this->tagStack).super_QList<QString>);
      doConversion((QString *)&local_48,this,iVar3.i + -1);
      pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,(QString *)&local_48);
      QTextStream::operator<<(pQVar2,'>');
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QList<QString>::removeLast(&(this->tagStack).super_QList<QString>);
    }
    else if (XVar1 == Bare) {
      if ((this->tagStack).super_QList<QString>.d.size == 0) {
        local_48.d._0_4_ = 2;
        local_48.size._4_4_ = 0;
        local_48._4_8_ = 0;
        local_48._12_8_ = 0;
        local_30 = "default";
        QMessageLogger::debug((char *)&local_48,"<Root>: Cannot close tag, no tags on stack");
      }
      else {
        local_48.d._0_4_ = 2;
        local_48.size._4_4_ = 0;
        local_48._4_8_ = 0;
        local_48._12_8_ = 0;
        local_30 = "default";
        QMessageLogger::debug
                  ((char *)&local_48,"<Root>: Cannot close tag in Bare state, %d tags on stack");
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void XmlOutput::closeTag()
{
    switch(currentState) {
        case Bare:
            if (tagStack.size())
                //warn_msg(WarnLogic, "<Root>: Cannot close tag in Bare state, %d tags on stack", tagStack.count());
                qDebug("<Root>: Cannot close tag in Bare state, %d tags on stack", int(tagStack.size()));
            else
                //warn_msg(WarnLogic, "<Root>: Cannot close tag, no tags on stack");
                qDebug("<Root>: Cannot close tag, no tags on stack");
            return;
        case Tag:
            decreaseIndent(); // <--- Pre-decrease indent
            if (format == NewLine)
                xmlFile << Qt::endl << currentIndent;
            xmlFile << "</" << doConversion(tagStack.last()) << '>';
            tagStack.pop_back();
            break;
        case Attribute:
            xmlFile << " />";
            tagStack.pop_back();
            currentState = Tag;
            decreaseIndent(); // <--- Post-decrease indent
            break;
    }
}